

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,OutputDirective *output_directive,GeneratorContext *generator_context)

{
  bool bVar1;
  int iVar2;
  Edition minimum_edition;
  Edition maximum_edition;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  LogMessage *this_00;
  CommandLineInterface *this_01;
  char *in_R9;
  string_view prefix;
  string_view suffix;
  string_view plugin_prefix;
  string_view text;
  string_view text_00;
  string_view directive;
  string parameters;
  string parameters_1;
  string error;
  
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  if (output_directive->generator == (CodeGenerator *)0x0) {
    prefix._M_str = "--";
    prefix._M_len = 2;
    text._M_str = (output_directive->name)._M_dataplus._M_p;
    text._M_len = (output_directive->name)._M_string_length;
    bVar1 = absl::lts_20250127::StartsWith(text,prefix);
    if (!bVar1) {
LAB_00abc1e0:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&parameters,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0xa5d,
                 "absl::StartsWith(output_directive.name, \"--\") && absl::EndsWith(output_directive.name, \"_out\")"
                );
      this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          ((LogMessage *)&parameters,
                           (char (*) [32])"Bad name for plugin generator: ");
      absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,&output_directive->name);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&parameters);
    }
    suffix._M_str = "_out";
    suffix._M_len = 4;
    text_00._M_str = (output_directive->name)._M_dataplus._M_p;
    text_00._M_len = (output_directive->name)._M_string_length;
    bVar1 = absl::lts_20250127::EndsWith(text_00,suffix);
    if (!bVar1) goto LAB_00abc1e0;
    plugin_prefix._M_str = (char *)(output_directive->name)._M_string_length;
    plugin_prefix._M_len = (size_t)(this->plugin_prefix_)._M_dataplus._M_p;
    directive._M_str = in_R9;
    directive._M_len = (size_t)(output_directive->name)._M_dataplus._M_p;
    compiler::(anonymous_namespace)::PluginName_abi_cxx11_
              (&parameters,(_anonymous_namespace_ *)(this->plugin_prefix_)._M_string_length,
               plugin_prefix,directive);
    std::__cxx11::string::string((string *)&parameters_1,(string *)&output_directive->parameter);
    pbVar3 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             ::
             operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                         *)&this->plugin_parameters_,&parameters);
    if (pbVar3->_M_string_length != 0) {
      if (parameters_1._M_string_length != 0) {
        std::__cxx11::string::append((char *)&parameters_1);
      }
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::
      operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&this->plugin_parameters_,&parameters);
      std::__cxx11::string::append((string *)&parameters_1);
    }
    bVar1 = GeneratePluginOutput
                      (this,parsed_files,&parameters,&parameters_1,generator_context,&error);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&parameters_1);
      goto LAB_00abc16e;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)output_directive);
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,(string *)&error);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&parameters_1);
  }
  else {
    std::__cxx11::string::string((string *)&parameters,(string *)&output_directive->parameter);
    pbVar3 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             ::
             operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                         *)&this->generator_parameters_,&output_directive->name);
    if (pbVar3->_M_string_length != 0) {
      if (parameters._M_string_length != 0) {
        std::__cxx11::string::append((char *)&parameters);
      }
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::
      operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&this->generator_parameters_,&output_directive->name);
      std::__cxx11::string::append((string *)&parameters);
    }
    this_01 = (CommandLineInterface *)output_directive->generator;
    iVar2 = (**(_func_int **)((long)(this_01->executable_name_)._M_dataplus._M_p + 0x20))();
    bVar1 = EnforceProto3OptionalSupport
                      (this_01,&output_directive->name,CONCAT44(extraout_var,iVar2),parsed_files);
    if (bVar1) {
      iVar2 = (*output_directive->generator->_vptr_CodeGenerator[4])();
      minimum_edition = (*output_directive->generator->_vptr_CodeGenerator[7])();
      maximum_edition = (*output_directive->generator->_vptr_CodeGenerator[8])();
      bVar1 = EnforceEditionsSupport
                        (this,&output_directive->name,CONCAT44(extraout_var_00,iVar2),
                         minimum_edition,maximum_edition,parsed_files);
      if (bVar1) {
        iVar2 = (*output_directive->generator->_vptr_CodeGenerator[3])
                          (output_directive->generator,parsed_files,&parameters,generator_context,
                           &error);
        if ((char)iVar2 != '\0') {
LAB_00abc16e:
          std::__cxx11::string::~string((string *)&parameters);
          bVar1 = true;
          goto LAB_00abc1c5;
        }
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)output_directive);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,(string *)&error);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
  }
  std::__cxx11::string::~string((string *)&parameters);
  bVar1 = false;
LAB_00abc1c5:
  std::__cxx11::string::~string((string *)&error);
  return bVar1;
}

Assistant:

bool CommandLineInterface::GenerateOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const OutputDirective& output_directive,
    GeneratorContext* generator_context) {
  // Call the generator.
  std::string error;
  if (output_directive.generator == nullptr) {
    // This is a plugin.
    ABSL_CHECK(absl::StartsWith(output_directive.name, "--") &&
               absl::EndsWith(output_directive.name, "_out"))
        << "Bad name for plugin generator: " << output_directive.name;

    std::string plugin_name = PluginName(plugin_prefix_, output_directive.name);
    std::string parameters = output_directive.parameter;
    if (!plugin_parameters_[plugin_name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(plugin_parameters_[plugin_name]);
    }
    if (!GeneratePluginOutput(parsed_files, plugin_name, parameters,
                              generator_context, &error)) {
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  } else {
    // Regular generator.
    std::string parameters = output_directive.parameter;
    if (!generator_parameters_[output_directive.name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(generator_parameters_[output_directive.name]);
    }
    if (!EnforceProto3OptionalSupport(
            output_directive.name,
            output_directive.generator->GetSupportedFeatures(), parsed_files)) {
      return false;
    }

    if (!EnforceEditionsSupport(
            output_directive.name,
            output_directive.generator->GetSupportedFeatures(),
            output_directive.generator->GetMinimumEdition(),
            output_directive.generator->GetMaximumEdition(), parsed_files)) {
      return false;
    }

    if (!output_directive.generator->GenerateAll(parsed_files, parameters,
                                                 generator_context, &error)) {
      // Generator returned an error.
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  }

  return true;
}